

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall chrono::robosimian::RoboSimian::SetCollide(RoboSimian *this,int flags)

{
  RS_Sled *this_00;
  __shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<chrono::robosimian::RS_Limb> limb;
  __shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  RS_Chassis::SetCollide
            ((this->m_chassis).
             super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (bool)((byte)flags & 1));
  this_00 = (this->m_sled).
            super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (RS_Sled *)0x0) {
    RS_Sled::SetCollide(this_00,SUB41((flags & 2U) >> 1,0));
  }
  p_Var1 = &((this->m_limbs).
             super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->m_limbs).
                  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var2);
    RS_Limb::SetCollideLinks(local_40._M_ptr,SUB41((flags & 4U) >> 2,0));
    RS_Limb::SetCollideWheel(local_40._M_ptr,SUB41((flags & 8U) >> 3,0));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void RoboSimian::SetCollide(int flags) {
    m_chassis->SetCollide((flags & static_cast<int>(CollisionFlags::CHASSIS)) != 0);

    if (m_sled)
        m_sled->SetCollide((flags & static_cast<int>(CollisionFlags::SLED)) != 0);

    for (auto limb : m_limbs) {
        limb->SetCollideLinks((flags & static_cast<int>(CollisionFlags::LIMBS)) != 0);
        limb->SetCollideWheel((flags & static_cast<int>(CollisionFlags::WHEELS)) != 0);
    }
}